

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall wabt::SharedValidator::OnBr(SharedValidator *this,Location *loc,Var *depth)

{
  Result RVar1;
  Result RVar2;
  char *pcVar3;
  
  this->expr_loc_ = loc;
  pcVar3 = Var::index(depth,(char *)loc,(int)depth);
  RVar1 = TypeChecker::OnBr(&this->typechecker_,(Index)pcVar3);
  RVar2.enum_._1_3_ = 0;
  RVar2.enum_._0_1_ = RVar1.enum_ == Error;
  return (Result)RVar2.enum_;
}

Assistant:

Result SharedValidator::OnBr(const Location& loc, Var depth) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  result |= typechecker_.OnBr(depth.index());
  return result;
}